

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O1

ostream * spvtools::utils::operator<<(ostream *os,FloatProxy<double> *value)

{
  double dVar1;
  undefined8 uVar2;
  char cVar3;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  local_18;
  
  dVar1 = (double)value->data_;
  cVar3 = '\x02';
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    if (NAN(dVar1)) {
      cVar3 = '\0';
    }
    else {
      cVar3 = '\x01';
      if (ABS(dVar1) != INFINITY) {
        cVar3 = (2.2250738585072014e-308 <= ABS(dVar1)) + '\x03';
      }
    }
  }
  if ((cVar3 == '\x04') || (cVar3 == '\x02')) {
    uVar2 = *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8);
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 0x11;
    std::ostream::_M_insert<double>(dVar1);
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = uVar2;
  }
  else {
    local_18.value_.data_ = (FloatProxy<double>)value->data_;
    operator<<(os,&local_18);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const FloatProxy<T>& value) {
  auto float_val = value.getAsFloat();
  switch (std::fpclassify(float_val)) {
    case FP_ZERO:
    case FP_NORMAL: {
      auto saved_precision = os.precision();
      os.precision(std::numeric_limits<T>::max_digits10);
      os << float_val;
      os.precision(saved_precision);
    } break;
    default:
      os << HexFloat<FloatProxy<T>>(value);
      break;
  }
  return os;
}